

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O2

void LZ4_renormDictT(LZ4_stream_t_internal *LZ4_dict,BYTE *src)

{
  uint uVar1;
  uint8_t *puVar2;
  uint uVar3;
  long lVar4;
  uint32_t uVar5;
  
  uVar3 = LZ4_dict->currentOffset;
  if ((BYTE *)0x80000000 < (BYTE *)(ulong)uVar3 || src < (BYTE *)(ulong)uVar3) {
    puVar2 = LZ4_dict->dictionary;
    uVar1 = LZ4_dict->dictSize;
    for (lVar4 = 0; lVar4 != 0x1000; lVar4 = lVar4 + 1) {
      uVar5 = LZ4_dict->hashTable[lVar4] - (uVar3 - 0x10000);
      if (LZ4_dict->hashTable[lVar4] < uVar3 - 0x10000) {
        uVar5 = 0;
      }
      LZ4_dict->hashTable[lVar4] = uVar5;
    }
    LZ4_dict->currentOffset = 0x10000;
    uVar3 = LZ4_dict->dictSize;
    if (0x10000 < uVar3) {
      LZ4_dict->dictSize = 0x10000;
      uVar3 = 0x10000;
    }
    LZ4_dict->dictionary = puVar2 + ((ulong)uVar1 - (ulong)uVar3);
  }
  return;
}

Assistant:

static void LZ4_renormDictT(LZ4_stream_t_internal* LZ4_dict, const BYTE* src)
{
    if ((LZ4_dict->currentOffset > 0x80000000) ||
        ((uptrval)LZ4_dict->currentOffset > (uptrval)src)) {   /* address space overflow */
        /* rescale hash table */
        U32 const delta = LZ4_dict->currentOffset - 64 KB;
        const BYTE* dictEnd = LZ4_dict->dictionary + LZ4_dict->dictSize;
        int i;
        for (i=0; i<LZ4_HASH_SIZE_U32; i++) {
            if (LZ4_dict->hashTable[i] < delta) LZ4_dict->hashTable[i]=0;
            else LZ4_dict->hashTable[i] -= delta;
        }
        LZ4_dict->currentOffset = 64 KB;
        if (LZ4_dict->dictSize > 64 KB) LZ4_dict->dictSize = 64 KB;
        LZ4_dict->dictionary = dictEnd - LZ4_dict->dictSize;
    }
}